

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

Element * Rml::FindFocusElement(Element *element)

{
  Focus FVar1;
  ElementDocument *this;
  ComputedValues *pCVar2;
  bool bVar3;
  ElementDocument *owner_document;
  Element *element_local;
  
  this = Element::GetOwnerDocument(element);
  if (this != (ElementDocument *)0x0) {
    pCVar2 = Element::GetComputedValues(&this->super_Element);
    FVar1 = Style::ComputedValues::focus(pCVar2);
    owner_document = (ElementDocument *)element;
    if (FVar1 != None) {
      while( true ) {
        bVar3 = false;
        if (owner_document != (ElementDocument *)0x0) {
          pCVar2 = Element::GetComputedValues(&owner_document->super_Element);
          FVar1 = Style::ComputedValues::focus(pCVar2);
          bVar3 = FVar1 == None;
        }
        if (!bVar3) break;
        owner_document = (ElementDocument *)Element::GetParentNode(&owner_document->super_Element);
      }
      return &owner_document->super_Element;
    }
  }
  return (Element *)0x0;
}

Assistant:

static Element* FindFocusElement(Element* element)
{
	ElementDocument* owner_document = element->GetOwnerDocument();
	if (!owner_document || owner_document->GetComputedValues().focus() == Style::Focus::None)
		return nullptr;

	while (element && element->GetComputedValues().focus() == Style::Focus::None)
	{
		element = element->GetParentNode();
	}

	return element;
}